

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

void __thiscall Iex_2_5::TypeExc::~TypeExc(TypeExc *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_BaseExc = &PTR__TypeExc_00163690;
  pcVar2 = (this->super_BaseExc)._stackTrace._M_dataplus._M_p;
  paVar1 = &(this->super_BaseExc)._stackTrace.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_BaseExc)._message._M_dataplus._M_p;
  paVar1 = &(this->super_BaseExc)._message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  return;
}

Assistant:

BaseExc::~BaseExc () throw ()
{
}